

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deserializer.hpp
# Opt level: O2

bool __thiscall
duckdb::Deserializer::ReadPropertyWithExplicitDefault<bool>
          (Deserializer *this,field_id_t field_id,char *tag,bool default_value)

{
  uint uVar1;
  int iVar2;
  _func_int **pp_Var3;
  undefined6 in_register_00000032;
  
  uVar1 = (*this->_vptr_Deserializer[4])(this,CONCAT62(in_register_00000032,field_id));
  pp_Var3 = this->_vptr_Deserializer;
  if ((char)uVar1 != '\0') {
    iVar2 = (*pp_Var3[0xc])(this);
    default_value = SUB41(iVar2,0);
    pp_Var3 = this->_vptr_Deserializer;
  }
  (*pp_Var3[5])(this,(ulong)(uVar1 & 0xff));
  return default_value;
}

Assistant:

inline T ReadPropertyWithExplicitDefault(const field_id_t field_id, const char *tag, T default_value) {
		if (!OnOptionalPropertyBegin(field_id, tag)) {
			OnOptionalPropertyEnd(false);
			return std::forward<T>(default_value);
		}
		auto ret = Read<T>();
		OnOptionalPropertyEnd(true);
		return ret;
	}